

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts_test.c
# Opt level: O3

int local_error(int code,char *fmt,...)

{
  char in_AL;
  int __status;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_d8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_d8.reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_d8.gp_offset = 0x10;
  local_d8.fp_offset = 0x30;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  __status = zt_opt_verror_default(code,fmt,&local_d8);
  if (__status == 0) {
    return 0;
  }
  exit(__status);
}

Assistant:

int
local_error(int code, char * fmt, ...) {
    /* we could capture any errors here
     * instead we will fail explicitly if
     * we get any.
     */
    int     ret;
    va_list ap;

    va_start(ap, fmt);
    ret = zt_opt_verror_default(code, fmt, ap);
    va_end(ap);

    if(ret != 0) {
        exit(ret);
    }

    return 0;
}